

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void place_branch(level *lev,branch *br,xchar x,xchar y)

{
  boolean bVar1;
  int iVar2;
  bool bVar3;
  byte local_3c;
  mkroom *local_38;
  mkroom *br_room;
  d_level *pdStack_28;
  boolean make_stairs;
  d_level *dest;
  coord m;
  xchar y_local;
  branch *pbStack_18;
  xchar x_local;
  branch *br_local;
  level *lev_local;
  
  if ((br != (branch *)0x0) && (made_branch == '\0')) {
    dest._6_1_ = y;
    dest._7_1_ = x;
    pbStack_18 = br;
    if (x == '\0') {
      local_38 = find_branch_room(lev,(coord *)((long)&dest + 4));
      dest._7_1_ = dest._4_1_;
      dest._6_1_ = dest._5_1_;
    }
    else {
      local_38 = pos_to_room(lev,x,y);
    }
    bVar1 = on_level(&pbStack_18->end1,&lev->z);
    if (bVar1 == '\0') {
      bVar3 = pbStack_18->type != 2;
      pdStack_28 = &pbStack_18->end1;
    }
    else {
      bVar3 = pbStack_18->type != 1;
      pdStack_28 = &pbStack_18->end2;
    }
    if (pbStack_18->type == 3) {
      mkportal(lev,dest._7_1_,dest._6_1_,pdStack_28->dnum,pdStack_28->dlevel);
    }
    else if (bVar3) {
      (lev->sstairs).sx = dest._7_1_;
      (lev->sstairs).sy = dest._6_1_;
      bVar1 = on_level(&pbStack_18->end1,&lev->z);
      if (bVar1 == '\0') {
        local_3c = (pbStack_18->end1_up != '\0' ^ 0xffU) & 1;
      }
      else {
        local_3c = pbStack_18->end1_up;
      }
      (lev->sstairs).up = local_3c;
      assign_level(&(lev->sstairs).tolev,pdStack_28);
      lev->sstairs_room = local_38;
      iVar2 = 2;
      if ((lev->sstairs).up != '\0') {
        iVar2 = 1;
      }
      *(uint *)&lev->locations[dest._7_1_][dest._6_1_].field_0x6 =
           *(uint *)&lev->locations[dest._7_1_][dest._6_1_].field_0x6 & 0xfffffe0f | iVar2 << 4;
      lev->locations[dest._7_1_][dest._6_1_].typ = '\x1a';
    }
    made_branch = '\x01';
  }
  return;
}

Assistant:

void place_branch(struct level *lev,
		  branch *br,		/* branch to place */
		  xchar x,  xchar y)	/* location */
{
	coord	      m;
	d_level	      *dest;
	boolean	      make_stairs;
	struct mkroom *br_room;

	/*
	 * Return immediately if there is no branch to make or we have
	 * already made one.  This routine can be called twice when
	 * a special level is loaded that specifies an SSTAIR location
	 * as a favored spot for a branch.
	 */
	if (!br || made_branch) return;

	if (!x) {	/* find random coordinates for branch */
	    br_room = find_branch_room(lev, &m);
	    x = m.x;
	    y = m.y;
	} else {
	    br_room = pos_to_room(lev, x, y);
	}

	if (on_level(&br->end1, &lev->z)) {
	    /* we're on end1 */
	    make_stairs = br->type != BR_NO_END1;
	    dest = &br->end2;
	} else {
	    /* we're on end2 */
	    make_stairs = br->type != BR_NO_END2;
	    dest = &br->end1;
	}

	if (br->type == BR_PORTAL) {
	    mkportal(lev, x, y, dest->dnum, dest->dlevel);
	} else if (make_stairs) {
	    lev->sstairs.sx = x;
	    lev->sstairs.sy = y;
	    lev->sstairs.up = (char) on_level(&br->end1, &lev->z) ?
					    br->end1_up : !br->end1_up;
	    assign_level(&lev->sstairs.tolev, dest);
	    lev->sstairs_room = br_room;

	    lev->locations[x][y].ladder = lev->sstairs.up ? LA_UP : LA_DOWN;
	    lev->locations[x][y].typ = STAIRS;
	}
	/*
	 * Set made_branch to TRUE even if we didn't make a stairwell (i.e.
	 * make_stairs is false) since there is currently only one branch
	 * per level, if we failed once, we're going to fail again on the
	 * next call.
	 */
	made_branch = TRUE;
}